

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::StyledStreamWriter::writeCommentAfterValueOnSameLine(StyledStreamWriter *this,Value *root)

{
  ostream *poVar1;
  bool bVar2;
  long in_RDI;
  undefined8 in_stack_ffffffffffffff78;
  CommentPlacement placement;
  StyledStreamWriter *in_stack_ffffffffffffff80;
  string *psVar3;
  Value *in_stack_ffffffffffffff88;
  string local_60 [48];
  string local_30 [48];
  
  placement = (CommentPlacement)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  bVar2 = Value::hasComment((Value *)in_stack_ffffffffffffff80,placement);
  if (bVar2) {
    in_stack_ffffffffffffff88 = (Value *)std::operator<<(*(ostream **)(in_RDI + 0x18),' ');
    Value::getComment_abi_cxx11_
              (in_stack_ffffffffffffff88,
               (CommentPlacement)((ulong)in_stack_ffffffffffffff80 >> 0x20));
    std::operator<<((ostream *)in_stack_ffffffffffffff88,local_30);
    std::__cxx11::string::~string(local_30);
  }
  bVar2 = Value::hasComment((Value *)in_stack_ffffffffffffff80,placement);
  if (bVar2) {
    writeIndent(in_stack_ffffffffffffff80);
    poVar1 = *(ostream **)(in_RDI + 0x18);
    psVar3 = local_60;
    Value::getComment_abi_cxx11_
              (in_stack_ffffffffffffff88,(CommentPlacement)((ulong)psVar3 >> 0x20));
    std::operator<<(poVar1,psVar3);
    std::__cxx11::string::~string(local_60);
  }
  *(byte *)(in_RDI + 0x68) = *(byte *)(in_RDI + 0x68) & 0xfd;
  return;
}

Assistant:

void StyledStreamWriter::writeCommentAfterValueOnSameLine(const Value& root) {
  if (root.hasComment(commentAfterOnSameLine))
    *document_ << ' ' << root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *document_ << root.getComment(commentAfter);
  }
  indented_ = false;
}